

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

GLFWjoystickfun glfwSetJoystickCallback(GLFWjoystickfun cbfun)

{
  GLFWjoystickfun p_Var1;
  GLFWbool GVar2;
  GLFWjoystickfun p_Var3;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    p_Var3 = (GLFWjoystickfun)0x0;
    p_Var1 = _glfw.callbacks.joystick;
  }
  else {
    GVar2 = initJoysticks();
    p_Var3 = _glfw.callbacks.joystick;
    p_Var1 = cbfun;
    if (GVar2 == 0) {
      p_Var3 = (GLFWjoystickfun)0x0;
      p_Var1 = _glfw.callbacks.joystick;
    }
  }
  _glfw.callbacks.joystick = p_Var1;
  return p_Var3;
}

Assistant:

GLFWAPI GLFWjoystickfun glfwSetJoystickCallback(GLFWjoystickfun cbfun)
{
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!initJoysticks())
        return NULL;

    _GLFW_SWAP(GLFWjoystickfun, _glfw.callbacks.joystick, cbfun);
    return cbfun;
}